

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# metacall_link.c
# Opt level: O0

int metacall_link_destroy(void)

{
  int iVar1;
  detour d;
  int result;
  set in_stack_fffffffffffffff0;
  undefined4 in_stack_fffffffffffffff8;
  int iVar2;
  
  iVar2 = 0;
  threading_mutex_lock((threading_mutex)0x13ba08);
  if (detour_link_handle != (detour_handle)0x0) {
    metacall_detour();
    in_stack_fffffffffffffff0 = (set)detour_create((char *)0x13ba1f);
    iVar1 = detour_uninstall((detour)CONCAT44(iVar2,in_stack_fffffffffffffff8),
                             (detour_handle)in_stack_fffffffffffffff0);
    if (iVar1 != 0) {
      log_write_impl_va("metacall",0xd0,"metacall_link_destroy",
                        "/workspace/llm4binary/github/license_c_cmakelists/metacall[P]core/source/metacall/source/metacall_link.c"
                        ,LOG_LEVEL_ERROR,"MetaCall invalid detour fork uninstall");
      iVar2 = 1;
    }
    detour_link_handle = (detour_handle)0x0;
  }
  if (metacall_link_table != (set)0x0) {
    set_destroy(in_stack_fffffffffffffff0);
    metacall_link_table = (set)0x0;
  }
  threading_mutex_unlock((threading_mutex)0x13baa8);
  threading_mutex_destroy((threading_mutex)0x13bab4);
  return iVar2;
}

Assistant:

int metacall_link_destroy(void)
{
	int result = 0;

	threading_mutex_lock(&link_mutex);

	if (detour_link_handle != NULL)
	{
		detour d = detour_create(metacall_detour());

		if (detour_uninstall(d, detour_link_handle) != 0)
		{
			log_write("metacall", LOG_LEVEL_ERROR, "MetaCall invalid detour fork uninstall");

			result = 1;
		}

		detour_link_handle = NULL;
	}

	if (metacall_link_table != NULL)
	{
		set_destroy(metacall_link_table);

		metacall_link_table = NULL;
	}

	threading_mutex_unlock(&link_mutex);

	threading_mutex_destroy(&link_mutex);

	return result;
}